

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

int absl::lts_20250127::strings_internal::Compare<84,84>(BigUnsigned<84> *lhs,BigUnsigned<84> *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  uVar1 = lhs->size_;
  uVar2 = rhs->size_;
  uVar3 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar5 = (ulong)uVar3;
  while( true ) {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) {
      return 0;
    }
    uVar6 = 0;
    uVar7 = 0;
    if (iVar4 <= (int)uVar1) {
      uVar7 = lhs->words_[uVar5 - 1];
    }
    if (iVar4 <= (int)uVar2) {
      uVar6 = rhs->words_[uVar5 - 1];
    }
    if (uVar7 < uVar6) break;
    uVar5 = uVar5 - 1;
    if (uVar6 < uVar7) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int size() const { return size_; }